

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

void quicly_ranges_drop_by_range_indices
               (quicly_ranges_t *ranges,size_t begin_range_index,size_t end_range_index)

{
  ulong uVar1;
  void *pvVar2;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  quicly_range_t *new_ranges;
  size_t new_capacity;
  size_t _n;
  
  if (in_RDX <= in_RSI) {
    __assert_fail("begin_range_index < end_range_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                  ,0x41,
                  "void quicly_ranges_drop_by_range_indices(quicly_ranges_t *, size_t, size_t)");
  }
  if (in_RDI[1] - in_RDX != 0) {
    memmove((void *)(*in_RDI + in_RSI * 0x10),(void *)(*in_RDI + in_RDX * 0x10),
            (in_RDI[1] - in_RDX) * 0x10);
  }
  in_RDI[1] = in_RDI[1] - (in_RDX - in_RSI);
  if ((4 < (ulong)in_RDI[2]) &&
     ((ulong)(in_RDI[1] * 3) < (ulong)in_RDI[2] || in_RDI[1] * 3 - in_RDI[2] == 0)) {
    uVar1 = in_RDI[2];
    pvVar2 = realloc((void *)*in_RDI,(uVar1 >> 1) << 4);
    if (pvVar2 != (void *)0x0) {
      *in_RDI = (long)pvVar2;
      in_RDI[2] = uVar1 >> 1;
    }
  }
  return;
}

Assistant:

void quicly_ranges_drop_by_range_indices(quicly_ranges_t *ranges, size_t begin_range_index, size_t end_range_index)
{
    assert(begin_range_index < end_range_index);

    MOVE(ranges->ranges + begin_range_index, ranges->ranges + end_range_index, ranges->num_ranges - end_range_index);
    ranges->num_ranges -= end_range_index - begin_range_index;
    if (ranges->capacity > 4 && ranges->num_ranges * 3 <= ranges->capacity) {
        size_t new_capacity = ranges->capacity / 2;
        quicly_range_t *new_ranges = realloc(ranges->ranges, new_capacity * sizeof(*new_ranges));
        if (new_ranges != NULL) {
            ranges->ranges = new_ranges;
            ranges->capacity = new_capacity;
        }
    }
}